

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t linear_hash_increment_num_records(linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  int iVar2;
  
  iVar2 = linear_hash->num_records + 1;
  linear_hash->num_records = iVar2;
  if ((double)linear_hash->split_threshold <
      (double)(iVar2 * 100) / (double)(linear_hash->records_per_bucket * linear_hash->num_buckets))
  {
    iVar1 = write_new_bucket(linear_hash->num_buckets,linear_hash);
    if (iVar1 == '\0') {
      iVar2 = linear_hash->num_buckets;
      linear_hash->num_buckets = iVar2 + 1;
      if (iVar2 == linear_hash->initial_size * 2) {
        linear_hash->initial_size = iVar2;
        linear_hash->next_split = 0;
      }
      iVar1 = split(linear_hash);
      return iVar1;
    }
  }
  else {
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_increment_num_records(
	linear_hash_table_t *linear_hash
) {
	linear_hash->num_records++;

	ion_err_t err = err_ok;

	if (linear_hash_above_threshold(linear_hash)) {
		err = write_new_bucket(linear_hash->num_buckets, linear_hash);

		if (err != err_ok) {
			return err;
		}

		linear_hash_increment_num_buckets(linear_hash);
		err = split(linear_hash);
	}

	return err;
}